

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O1

void __thiscall
GlobOpt::FinalizeInductionVariables(GlobOpt *this,Loop *loop,GlobOptBlockData *headerData)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BasicBlock *pBVar4;
  GlobOptBlockData *this_00;
  IntConstantBounds IVar5;
  InductionVariable *this_01;
  StackSym *sym;
  Value *value;
  IntConstantBounds *pIVar6;
  ValueInfo *pVVar7;
  undefined1 local_88 [8];
  EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  it;
  IntConstantBounds local_50;
  IntConstantBounds landingPadConstantBounds;
  IntConstantBounds local_40;
  IntConstantBounds constantBounds;
  
  bVar2 = DoBoundCheckHoist(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x4b3,"(DoBoundCheckHoist())","DoBoundCheckHoist()");
    if (!bVar2) goto LAB_004ac462;
    *puVar3 = 0;
  }
  if (this->prePassLoop != (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x4b4,"(!IsLoopPrePass())","!IsLoopPrePass()");
    if (!bVar2) goto LAB_004ac462;
    *puVar3 = 0;
  }
  if (loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x4b5,"(loop)","loop");
    if (!bVar2) goto LAB_004ac462;
    *puVar3 = 0;
  }
  pBVar4 = Loop::GetHeadBlock(loop);
  if (pBVar4 != this->currentBlock) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x4b6,"(loop->GetHeadBlock() == currentBlock)",
                       "loop->GetHeadBlock() == currentBlock");
    if (!bVar2) goto LAB_004ac462;
    *puVar3 = 0;
  }
  if (loop->inductionVariables == (InductionVariableSet *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x4b7,"(loop->inductionVariables)","loop->inductionVariables");
    if (!bVar2) goto LAB_004ac462;
    *puVar3 = 0;
  }
  if ((this->currentBlock->field_0x18 & 4) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x4b8,"(currentBlock->isLoopHeader)","currentBlock->isLoopHeader");
    if (!bVar2) {
LAB_004ac462:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = &loop->landingPad->globOptData;
  JsUtil::
  BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                   *)local_88,loop->inductionVariables);
  bVar2 = JsUtil::
          BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::
          EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
          ::IsValid((EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                     *)local_88);
  if (!bVar2) {
    return;
  }
  IVar5 = (IntConstantBounds)__tls_get_addr(&PTR_0155fe48);
  it.
  super_IteratorBase<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
  ._24_8_ = headerData;
  constantBounds = IVar5;
LAB_004ac149:
  this_01 = (InductionVariable *)
            JsUtil::
            BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::
            IteratorBase<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
            ::Current((IteratorBase<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                       *)local_88);
  bVar2 = InductionVariable::IsChangeDeterminate(this_01);
  if (bVar2) {
    bVar2 = InductionVariable::IsChangeUnidirectional(this_01);
    if (bVar2) {
      sym = InductionVariable::Sym(this_01);
      bVar2 = GlobOptBlockData::IsInt32TypeSpecialized(headerData,&sym->super_Sym);
      if (bVar2) {
        bVar2 = GlobOptBlockData::IsInt32TypeSpecialized(this_00,&sym->super_Sym);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)IVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                             ,0x4d0,"(landingPadBlockData.IsInt32TypeSpecialized(sym))",
                             "landingPadBlockData.IsInt32TypeSpecialized(sym)");
          if (!bVar2) goto LAB_004ac462;
          *(undefined4 *)IVar5 = 0;
        }
        value = GlobOptBlockData::FindValue(headerData,&sym->super_Sym);
        if (value == (Value *)0x0) {
          InductionVariable::SetChangeIsIndeterminate(this_01);
          IVar5 = constantBounds;
          goto LAB_004ac43b;
        }
        landingPadConstantBounds =
             (IntConstantBounds)GlobOptBlockData::FindValue(this_00,&sym->super_Sym);
        if (landingPadConstantBounds == (IntConstantBounds)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          IVar5 = constantBounds;
          *(undefined4 *)constantBounds = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                             ,0x4d9,"(landingPadValue)","landingPadValue");
          if (!bVar2) goto LAB_004ac462;
          *(undefined4 *)IVar5 = 0;
        }
        local_40.lowerBound = 0;
        local_40.upperBound = 0;
        local_50.lowerBound = 0;
        local_50.upperBound = 0;
        bVar2 = ValueInfo::TryGetIntConstantBounds(value->valueInfo,&local_40,false);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          IVar5 = constantBounds;
          *(undefined4 *)constantBounds = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                             ,0x4dc,
                             "(value->GetValueInfo()->TryGetIntConstantBounds(&constantBounds))",
                             "value->GetValueInfo()->TryGetIntConstantBounds(&constantBounds)");
          if (!bVar2) goto LAB_004ac462;
          *(undefined4 *)IVar5 = 0;
        }
        bVar2 = ValueInfo::TryGetIntConstantBounds
                          (*(ValueInfo **)((long)landingPadConstantBounds + 8),&local_50,true);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          IVar5 = constantBounds;
          *(undefined4 *)constantBounds = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                             ,0x4dd,
                             "(landingPadValue->GetValueInfo()->TryGetIntConstantBounds(&landingPadConstantBounds, true))"
                             ,
                             "landingPadValue->GetValueInfo()->TryGetIntConstantBounds(&landingPadConstantBounds, true)"
                            );
          if (!bVar2) goto LAB_004ac462;
          *(undefined4 *)IVar5 = 0;
        }
        pIVar6 = InductionVariable::ChangeBounds(this_01);
        if (-1 < pIVar6->lowerBound) {
          pVVar7 = UpdateIntBoundsForGreaterThanOrEqual
                             (this,value,&local_40,(Value *)landingPadConstantBounds,&local_50,0,
                              true);
          ChangeValueInfo(this,(BasicBlock *)0x0,value,pVVar7,false,false);
          pIVar6 = InductionVariable::ChangeBounds(this_01);
          if ((pIVar6->upperBound == 0) &&
             (bVar2 = ValueInfo::TryGetIntConstantBounds(pVVar7,&local_40,true), !bVar2)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            IVar5 = constantBounds;
            *(undefined4 *)constantBounds = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                               ,0x4e8,
                               "(newValueInfo->TryGetIntConstantBounds(&constantBounds, true))",
                               "newValueInfo->TryGetIntConstantBounds(&constantBounds, true)");
            if (!bVar2) goto LAB_004ac462;
            *(undefined4 *)IVar5 = 0;
          }
        }
        pIVar6 = InductionVariable::ChangeBounds(this_01);
        headerData = (GlobOptBlockData *)
                     it.
                     super_IteratorBase<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                     ._24_8_;
        IVar5 = constantBounds;
        if (pIVar6->upperBound < 1) {
          pVVar7 = UpdateIntBoundsForLessThanOrEqual
                             (this,value,&local_40,(Value *)landingPadConstantBounds,&local_50,0,
                              true);
          ChangeValueInfo(this,(BasicBlock *)0x0,value,pVVar7,false,false);
          headerData = (GlobOptBlockData *)
                       it.
                       super_IteratorBase<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                       ._24_8_;
          IVar5 = constantBounds;
        }
        goto LAB_004ac43b;
      }
    }
    InductionVariable::SetChangeIsIndeterminate(this_01);
  }
LAB_004ac43b:
  JsUtil::
  BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::MoveNext((EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
              *)local_88);
  bVar2 = JsUtil::
          BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::
          EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
          ::IsValid((EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                     *)local_88);
  if (!bVar2) {
    return;
  }
  goto LAB_004ac149;
}

Assistant:

void GlobOpt::FinalizeInductionVariables(Loop *const loop, GlobOptBlockData *const headerData)
{
    Assert(DoBoundCheckHoist());
    Assert(!IsLoopPrePass());
    Assert(loop);
    Assert(loop->GetHeadBlock() == currentBlock);
    Assert(loop->inductionVariables);
    Assert(currentBlock->isLoopHeader);
    //Assert(headerData == &this->currentBlock->globOptData);

    // Clean up induction variables and for each, install a relationship between its values inside and outside the loop.
    GlobOptBlockData &landingPadBlockData = loop->landingPad->globOptData;
    for(auto it = loop->inductionVariables->GetIterator(); it.IsValid(); it.MoveNext())
    {
        InductionVariable &inductionVariable = it.CurrentValueReference();
        if(!inductionVariable.IsChangeDeterminate())
        {
            continue;
        }
        if(!inductionVariable.IsChangeUnidirectional())
        {
            inductionVariable.SetChangeIsIndeterminate();
            continue;
        }

        StackSym *const sym = inductionVariable.Sym();
        if(!headerData->IsInt32TypeSpecialized(sym))
        {
            inductionVariable.SetChangeIsIndeterminate();
            continue;
        }
        Assert(landingPadBlockData.IsInt32TypeSpecialized(sym));

        Value *const value = headerData->FindValue(sym);
        if(!value)
        {
            inductionVariable.SetChangeIsIndeterminate();
            continue;
        }
        Value *const landingPadValue = landingPadBlockData.FindValue(sym);
        Assert(landingPadValue);

        IntConstantBounds constantBounds, landingPadConstantBounds;
        AssertVerify(value->GetValueInfo()->TryGetIntConstantBounds(&constantBounds));
        AssertVerify(landingPadValue->GetValueInfo()->TryGetIntConstantBounds(&landingPadConstantBounds, true));

        // For an induction variable i, update the value of i inside the loop to indicate that it is bounded by the value of i
        // just before the loop.
        if(inductionVariable.ChangeBounds().LowerBound() >= 0)
        {
            ValueInfo *const newValueInfo =
                UpdateIntBoundsForGreaterThanOrEqual(value, constantBounds, landingPadValue, landingPadConstantBounds, true);
            ChangeValueInfo(nullptr, value, newValueInfo);
            if(inductionVariable.ChangeBounds().UpperBound() == 0)
            {
                AssertVerify(newValueInfo->TryGetIntConstantBounds(&constantBounds, true));
            }
        }
        if(inductionVariable.ChangeBounds().UpperBound() <= 0)
        {
            ValueInfo *const newValueInfo =
                UpdateIntBoundsForLessThanOrEqual(value, constantBounds, landingPadValue, landingPadConstantBounds, true);
            ChangeValueInfo(nullptr, value, newValueInfo);
        }
    }
}